

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void set_node_pos(c2m_ctx_t c2m_ctx,node_t_conflict n,pos_t pos)

{
  int *piVar1;
  uint uVar2;
  VARR_pos_t *pVVar3;
  ulong *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  code *pcVar8;
  pos_t *ppVar9;
  c2m_ctx_t __ptr;
  pos_t *extraout_RAX;
  void *pvVar10;
  pos_t *res;
  int extraout_EDX;
  undefined1 *puVar11;
  uint uVar12;
  int iVar13;
  undefined8 unaff_RBX;
  uint *puVar14;
  uint *puVar15;
  ulong *puVar16;
  uint uVar17;
  uint uVar18;
  node_t_conflict __size;
  c2m_ctx_t htab;
  long lVar19;
  undefined4 *puVar20;
  uint uVar21;
  ulong uVar22;
  macro_t unaff_R14;
  uint *puVar23;
  undefined8 *puVar24;
  
  pVVar3 = c2m_ctx->node_positions;
  htab = c2m_ctx;
  __size = n;
  while (pVVar3 != (VARR_pos_t *)0x0) {
    ppVar9 = (pos_t *)(ulong)n->uid;
    res = (pos_t *)pVVar3->els_num;
    unaff_RBX = pos._8_8_;
    unaff_R14 = (macro_t)pos.fname;
    if (ppVar9 < res) goto LAB_0017ab5a;
    __ptr = (c2m_ctx_t)pVVar3->varr;
    if (__ptr == (c2m_ctx_t)0x0) {
      set_node_pos_cold_1();
      goto LAB_0017ab84;
    }
    puVar11 = (undefined1 *)((long)&res->fname + 1);
    if ((pos_t *)pVVar3->size <= res) {
      __size = (node_t_conflict)((long)(puVar11 + ((ulong)puVar11 >> 1)) * 0x10);
      htab = __ptr;
      __ptr = (c2m_ctx_t)realloc(__ptr,(size_t)__size);
      pVVar3->varr = (pos_t *)__ptr;
      pVVar3->size = (size_t)(puVar11 + ((ulong)puVar11 >> 1));
      res = (pos_t *)pVVar3->els_num;
      puVar11 = (undefined1 *)((long)&res->fname + 1);
    }
    pVVar3->els_num = (size_t)puVar11;
    __ptr->env[0].__jmpbuf[(long)res * 2 + -2] = 0;
    __ptr->env[0].__jmpbuf[(long)res * 2 + -1] = -1;
    pVVar3 = c2m_ctx->node_positions;
  }
  set_node_pos_cold_3();
  ppVar9 = extraout_RAX;
LAB_0017ab5a:
  res = pVVar3->varr;
  if (res != (pos_t *)0x0) {
    res[(long)ppVar9].fname = (char *)unaff_R14;
    res[(long)ppVar9].lno = (int)unaff_RBX;
    res[(long)ppVar9].ln_pos = (int)((ulong)unaff_RBX >> 0x20);
    return;
  }
LAB_0017ab84:
  set_node_pos_cold_2();
  puVar4 = (ulong *)htab->env[0].__jmpbuf[5];
  if (puVar4 == (ulong *)0x0) {
    HTAB_macro_t_do_cold_8();
LAB_0017aee0:
    HTAB_macro_t_do_cold_7();
LAB_0017aee5:
    HTAB_macro_t_do_cold_4();
LAB_0017aeea:
    HTAB_macro_t_do_cold_3();
LAB_0017aeef:
    HTAB_macro_t_do_cold_5();
LAB_0017aef4:
    HTAB_macro_t_do_cold_6();
  }
  else {
    puVar24 = (undefined8 *)htab->env[0].__jmpbuf[4];
    if (puVar24 == (undefined8 *)0x0) goto LAB_0017aee0;
    lVar5 = htab->env[0].__jmpbuf[0];
    uVar18 = (uint)*puVar4;
    uVar12 = uVar18;
    if ((1 < extraout_EDX - 1U) || (iVar13 = (int)*puVar24, *(int *)&htab->options != iVar13)) {
LAB_0017ac08:
      iVar13 = (*(code *)htab->env[0].__jmpbuf[1])(__size,lVar5);
      uVar18 = iVar13 + (uint)(iVar13 == 0);
      lVar6 = htab->env[0].__jmpbuf[5];
      if (lVar6 == 0) goto LAB_0017aee5;
      lVar7 = htab->env[0].__jmpbuf[4];
      if (lVar7 != 0) {
        lVar6 = *(long *)(lVar6 + 0x10);
        lVar7 = *(long *)(lVar7 + 0x10);
        puVar14 = (uint *)0x0;
        uVar21 = uVar18;
        uVar17 = uVar18;
        do {
          uVar17 = uVar17 & uVar12 - 1;
          puVar23 = (uint *)(lVar6 + (ulong)uVar17 * 4);
          uVar2 = *puVar23;
          puVar15 = puVar23;
          if ((ulong)uVar2 != 0xfffffffe) {
            if (uVar2 == 0xffffffff) {
              if (1 < extraout_EDX - 1U) {
                return;
              }
              *(int *)&htab->ctx = *(int *)&htab->ctx + 1;
              uVar12 = *(uint *)&htab->options;
              if (puVar14 != (uint *)0x0) {
                puVar23 = puVar14;
              }
              *(uint *)(lVar7 + (ulong)uVar12 * 0x10) = uVar18;
              *(node_t_conflict *)(lVar7 + 8 + (ulong)uVar12 * 0x10) = __size;
              *(uint *)&htab->options = uVar12 + 1;
              *puVar23 = uVar12;
              res->fname = (char *)__size;
              return;
            }
            lVar19 = (ulong)uVar2 * 0x10;
            puVar15 = puVar14;
            if (*(uint *)(lVar7 + lVar19) == uVar18) {
              puVar20 = (undefined4 *)(lVar19 + lVar7);
              iVar13 = (*(code *)htab->env[0].__jmpbuf[2])
                                 (*(undefined8 *)(puVar20 + 2),__size,lVar5);
              if (iVar13 != 0) {
                if (extraout_EDX == 2) {
                  pcVar8 = (code *)htab->env[0].__jmpbuf[3];
                  if (pcVar8 != (code *)0x0) {
                    (*pcVar8)(*(undefined8 *)(puVar20 + 2),lVar5);
                  }
                  *(node_t_conflict *)(puVar20 + 2) = __size;
                }
                else {
                  if (extraout_EDX == 3) {
                    *(int *)&htab->ctx = *(int *)&htab->ctx + -1;
                    *puVar23 = 0xfffffffe;
                    pcVar8 = (code *)htab->env[0].__jmpbuf[3];
                    if (pcVar8 != (code *)0x0) {
                      (*pcVar8)(*(undefined8 *)(puVar20 + 2),lVar5);
                    }
                    *puVar20 = 0;
                    return;
                  }
                  __size = *(node_t_conflict *)(puVar20 + 2);
                }
                res->fname = (char *)__size;
                return;
              }
            }
          }
          piVar1 = (int *)((long)&htab->options + 4);
          *piVar1 = *piVar1 + 1;
          uVar21 = uVar21 >> 0xb;
          uVar17 = uVar21 + 1 + uVar17 * 5;
          puVar14 = puVar15;
        } while( true );
      }
      goto LAB_0017aeea;
    }
    if ((void *)puVar4[2] == (void *)0x0) goto LAB_0017aef4;
    uVar12 = uVar18 * 2;
    uVar22 = (ulong)uVar12;
    if (puVar4[1] == uVar22) {
      *puVar4 = uVar22;
      puVar16 = puVar4;
LAB_0017ada7:
      if (uVar12 != 0) {
        memset((void *)puVar16[2],0xff,(ulong)(uVar18 & 0x7fffffff) << 3);
      }
      puVar4 = (ulong *)htab->env[0].__jmpbuf[4];
      if ((puVar4 != (ulong *)0x0) && ((void *)puVar4[2] != (void *)0x0)) {
        uVar22 = (ulong)(uint)(iVar13 * 2);
        if (puVar4[1] == uVar22) {
          *puVar4 = uVar22;
          puVar16 = puVar4;
        }
        else {
          pvVar10 = realloc((void *)puVar4[2],uVar22 << 4);
          puVar4[2] = (ulong)pvVar10;
          puVar16 = (ulong *)htab->env[0].__jmpbuf[4];
          puVar4[1] = uVar22;
          *puVar4 = uVar22;
          if (puVar16 == (ulong *)0x0) goto LAB_0017aefe;
        }
        uVar22 = puVar16[2];
        uVar18 = *(uint *)((long)&htab->ctx + 4);
        uVar17 = *(uint *)&htab->options;
        *(undefined4 *)&htab->ctx = 0;
        *(undefined4 *)&htab->options = 0;
        *(undefined4 *)((long)&htab->ctx + 4) = 0;
        if (uVar18 < uVar17) {
          iVar13 = uVar17 - uVar18;
          puVar24 = (undefined8 *)((ulong)uVar18 * 0x10 + 8 + uVar22);
          do {
            if (*(int *)(puVar24 + -1) != 0) {
              HTAB_macro_t_do((HTAB_macro_t *)htab,(macro_t)*puVar24,HTAB_INSERT,(macro_t *)res);
              (*(code *)htab->env[0].__jmpbuf[2])((macro_t)res->fname,*puVar24,lVar5);
            }
            puVar24 = puVar24 + 2;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        goto LAB_0017ac08;
      }
      goto LAB_0017aeef;
    }
    pvVar10 = realloc((void *)puVar4[2],uVar22 * 4);
    puVar4[2] = (ulong)pvVar10;
    puVar16 = (ulong *)htab->env[0].__jmpbuf[5];
    puVar4[1] = uVar22;
    *puVar4 = uVar22;
    if (puVar16 != (ulong *)0x0) goto LAB_0017ada7;
  }
  HTAB_macro_t_do_cold_1();
LAB_0017aefe:
  HTAB_macro_t_do_cold_2();
  return;
}

Assistant:

static void set_node_pos (c2m_ctx_t c2m_ctx, node_t n, pos_t pos) {
  while (n->uid >= VARR_LENGTH (pos_t, node_positions)) VARR_PUSH (pos_t, node_positions, no_pos);
  VARR_SET (pos_t, node_positions, n->uid, pos);
}